

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSpline.cpp
# Opt level: O1

void __thiscall
IGACpp::BSpline::setKnotVectors(BSpline *this,vector<double,_std::allocator<double>_> *knotVector)

{
  double *pdVar1;
  pointer pdVar2;
  long lVar3;
  runtime_error *this_00;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  pdVar2 = (knotVector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(knotVector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2 >> 3;
  lVar3 = lVar5 + (ulong)(lVar5 == 0);
  lVar7 = 0;
  while( true ) {
    if (lVar5 + -1 == lVar7) {
      std::vector<double,_std::allocator<double>_>::operator=(&this->_knotVector,knotVector);
      return;
    }
    lVar6 = lVar5;
    if ((lVar5 == lVar7) || (lVar6 = lVar3, lVar3 + -1 == lVar7)) break;
    pdVar1 = pdVar2 + lVar7;
    lVar6 = lVar7 + 1;
    lVar7 = lVar7 + 1;
    if (pdVar2[lVar6] <= *pdVar1 && *pdVar1 != pdVar2[lVar6]) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"BSpline::setKnotVectors: knot vector must be in increasing order.");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  uVar4 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     lVar6);
  __cxa_free_exception();
  _Unwind_Resume(uVar4);
}

Assistant:

void BSpline::setKnotVectors(std::vector<double> knotVector)
    {
        // check if the given knot vector is non-decreasing
        for (size_t i{}; i < (knotVector.size() - 1); ++i)
        {
            if (knotVector.at(i) > knotVector.at(i + 1))
            {
                throw std::runtime_error("BSpline::setKnotVectors: knot vector must be in increasing order.");
            }
        }

        // set knotvector
        _knotVector = knotVector;
    }